

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O2

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::CSVMultiFileInfo::GetCardinality
          (CSVMultiFileInfo *this,MultiFileBindData *bind_data,idx_t file_count)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer pTVar3;
  CSVBufferManager *pCVar4;
  pointer this_00;
  idx_t iVar5;
  ulong uVar6;
  unsigned_long local_30;
  
  pTVar3 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->(&bind_data->bind_data);
  uVar6 = 0x2a;
  if (pTVar3[0x23].super_FunctionData._vptr_FunctionData != (_func_int **)0x0) {
    pCVar4 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                       ((shared_ptr<duckdb::CSVBufferManager,_true> *)(pTVar3 + 0x23));
    if ((CSVFileHandle *)
        (pCVar4->file_handle).
        super_unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>._M_t.
        super___uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>
        .super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false> != (CSVFileHandle *)0x0) {
      pLVar1 = (bind_data->types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pLVar2 = (bind_data->types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start;
      pCVar4 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                         ((shared_ptr<duckdb::CSVBufferManager,_true> *)(pTVar3 + 0x23));
      this_00 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>
                ::operator->(&pCVar4->file_handle);
      iVar5 = CSVFileHandle::FileSize(this_00);
      uVar6 = iVar5 / (ulong)((((long)pLVar1 - (long)pLVar2) / 0x18) * 5);
    }
  }
  local_30 = uVar6 * file_count;
  make_uniq<duckdb::NodeStatistics,unsigned_long>((duckdb *)this,&local_30);
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)this;
}

Assistant:

unique_ptr<NodeStatistics> CSVMultiFileInfo::GetCardinality(const MultiFileBindData &bind_data, idx_t file_count) {
	auto &csv_data = bind_data.bind_data->Cast<ReadCSVData>();
	// determined through the scientific method as the average amount of rows in a CSV file
	idx_t per_file_cardinality = 42;
	if (csv_data.buffer_manager && csv_data.buffer_manager->file_handle) {
		auto estimated_row_width = (bind_data.types.size() * 5);
		per_file_cardinality = csv_data.buffer_manager->file_handle->FileSize() / estimated_row_width;
	}
	return make_uniq<NodeStatistics>(file_count * per_file_cardinality);
}